

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O3

void __thiscall
asl::WebSocketServer::process(WebSocketServer *this,Socket *client,Dic<asl::String> *headers)

{
  Mutex *__mutex;
  int *piVar1;
  SmartObject_ *pSVar2;
  bool bVar3;
  int iVar4;
  String *pSVar5;
  anon_union_16_2_78e7fdac_for_String_2 *paVar6;
  undefined8 uVar7;
  char *pcVar8;
  long lVar9;
  Lock l;
  bool bVar10;
  WebSocket ws;
  String key;
  String digest;
  Hash hash;
  undefined1 local_d8 [56];
  String local_a0;
  undefined1 local_88 [16];
  anon_union_16_2_78e7fdac_for_String_2 local_78;
  String local_68;
  WebSocketServer *local_50;
  undefined1 *local_48;
  anon_union_16_2_78e7fdac_for_String_2 local_40;
  
  String::String((String *)local_d8,"Upgrade");
  iVar4 = Map<asl::String,_asl::String>::indexOf
                    (&headers->super_Map<asl::String,_asl::String>,(String *)local_d8);
  if (iVar4 < 0) {
    bVar3 = true;
  }
  else {
    String::String(&local_a0,"Upgrade");
    pSVar5 = Map<asl::String,_asl::String>::operator[]
                       (&headers->super_Map<asl::String,_asl::String>,&local_a0);
    if (pSVar5->_size == 0) {
      paVar6 = &pSVar5->field_2;
    }
    else {
      paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)(pSVar5->field_2)._str;
    }
    iVar4 = strcmp(paVar6->_space,"websocket");
    bVar3 = true;
    if (iVar4 == 0) {
      String::String((String *)(local_88 + 8),"Connection");
      pSVar5 = Map<asl::String,_asl::String>::operator[]
                         (&headers->super_Map<asl::String,_asl::String>,(String *)(local_88 + 8));
      String::String(&local_68,", ");
      String::split((String *)local_88,pSVar5);
      String::String((String *)&local_48,"Upgrade");
      iVar4 = *(int *)&((String *)(local_88._0_8_ + -0x18))->field_2;
      if ((long)iVar4 < 1) {
        bVar3 = true;
      }
      else {
        lVar9 = 0;
        local_50 = this;
        do {
          bVar3 = String::operator==((String *)((long)(int *)local_88._0_8_ + lVar9),
                                     (String *)&local_48);
          if (bVar3) break;
          bVar10 = (long)iVar4 * 0x18 + -0x18 != lVar9;
          lVar9 = lVar9 + 0x18;
        } while (bVar10);
        bVar3 = !bVar3;
        this = local_50;
      }
      if ((int)local_48 != 0) {
        free(local_40._str);
      }
      Array<asl::String>::~Array((Array<asl::String> *)local_88);
      if (local_68._size != 0) {
        free(local_68.field_2._str);
      }
      if (local_88._8_4_ != 0) {
        free(local_78._str);
      }
    }
    if (local_a0._size != 0) {
      free(local_a0.field_2._str);
    }
  }
  if (local_d8._0_4_ != 0) {
    free((void *)local_d8._8_8_);
  }
  if (bVar3) {
    pSVar2 = (client->super_SmartObject)._p;
    (*pSVar2->_vptr_SmartObject_[0xe])
              (pSVar2,"HTTP/1.1 400 Bad request\r\n\r\nNot a WebSocket request",0x33);
  }
  else {
    String::String((String *)local_d8,"Sec-Websocket-Key");
    pSVar5 = Map<asl::String,_asl::String>::operator[]
                       (&headers->super_Map<asl::String,_asl::String>,(String *)local_d8);
    iVar4 = pSVar5->_len;
    String::alloc(&local_a0,iVar4);
    uVar7 = local_a0.field_2._str;
    if (local_a0._size == 0) {
      uVar7 = &local_a0.field_2;
    }
    if (pSVar5->_size == 0) {
      paVar6 = &pSVar5->field_2;
    }
    else {
      paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)(pSVar5->field_2)._str;
    }
    local_a0._len = iVar4;
    memcpy((void *)uVar7,paVar6,(long)iVar4 + 1);
    if (local_d8._0_4_ != 0) {
      free((void *)local_d8._8_8_);
    }
    String::concat((String *)local_d8,&local_a0,"258EAFA5-E914-47DA-95CA-C5AB0DC85B11",0x24);
    SHA1::hash((Hash *)&local_68,(String *)local_d8);
    if (local_d8._0_4_ != 0) {
      free((void *)local_d8._8_8_);
    }
    encodeBase64((String *)(local_88 + 8),(byte *)&local_68,0x14);
    uVar7 = local_78._str;
    if (local_88._8_4_ == 0) {
      uVar7 = &local_78;
    }
    String::String((String *)local_d8,0xb4,
                   "HTTP/1.1 101 Switching Protocols\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Accept: %s\r\n"
                   ,uVar7);
    pcVar8 = (char *)local_d8._8_8_;
    if (local_d8._0_4_ == 0) {
      pcVar8 = local_d8 + 8;
    }
    pSVar2 = (client->super_SmartObject)._p;
    (*pSVar2->_vptr_SmartObject_[0xe])(pSVar2,pcVar8,(ulong)(uint)local_d8._4_4_);
    if (local_d8._0_4_ != 0) {
      free((void *)local_d8._8_8_);
    }
    String::String((String *)local_d8,"Sec-Websocket-Protocol");
    iVar4 = Map<asl::String,_asl::String>::indexOf
                      (&headers->super_Map<asl::String,_asl::String>,(String *)local_d8);
    if (local_d8._0_4_ != 0) {
      free((void *)local_d8._8_8_);
    }
    if (-1 < iVar4) {
      pSVar2 = (client->super_SmartObject)._p;
      (*pSVar2->_vptr_SmartObject_[0xe])(pSVar2,"Sec-Websocket-Protocol: chat\r\n",0x1e);
    }
    pSVar2 = (client->super_SmartObject)._p;
    (*pSVar2->_vptr_SmartObject_[0xe])(pSVar2,"\r\n",2);
    WebSocket::WebSocket((WebSocket *)local_d8,client,false);
    __mutex = &this->_mutex;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    local_48 = (undefined1 *)local_d8;
    Array<asl::WebSocket_*>::insert(&this->_clients,-1,(WebSocket **)&local_48);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    (*(this->super_SocketServer)._vptr_SocketServer[1])(this,local_d8);
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    local_48 = (undefined1 *)local_d8;
    Array<asl::WebSocket_*>::removeOne(&this->_clients,(WebSocket **)&local_48,0);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    (*((client->super_SmartObject)._p)->_vptr_SmartObject_[0xb])();
    LOCK();
    piVar1 = (int *)(local_d8._8_8_ + -8);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      free((char *)(local_d8._8_8_ + -0x10));
      local_d8._8_8_ = (char *)0x0;
    }
    if (CONCAT44(local_d8._4_4_,local_d8._0_4_) != 0) {
      LOCK();
      piVar1 = (int *)(CONCAT44(local_d8._4_4_,local_d8._0_4_) + 8);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if ((*piVar1 == 0) && ((long *)CONCAT44(local_d8._4_4_,local_d8._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_d8._4_4_,local_d8._0_4_) + 8))();
      }
    }
    if (local_88._8_4_ != 0) {
      free(local_78._str);
    }
    if (local_a0._size != 0) {
      free(local_a0.field_2._str);
    }
  }
  return;
}

Assistant:

void WebSocketServer::process(Socket& client, const Dic<String>& headers)
{
	if (!headers.has("Upgrade") || headers["Upgrade"] != "websocket" || !headers["Connection"].split(", ").contains("Upgrade"))
	{
		client << "HTTP/1.1 400 Bad request\r\n\r\nNot a WebSocket request";
		return;
	}

	String key = headers["Sec-Websocket-Key"];

	SHA1::Hash hash = SHA1::hash(key + "258EAFA5-E914-47DA-95CA-C5AB0DC85B11");
	String digest = encodeBase64(hash, hash.length());

	client << String(180, "HTTP/1.1 101 Switching Protocols\r\n"
		"Upgrade: websocket\r\n"
		"Connection: Upgrade\r\n"
		"Sec-WebSocket-Accept: %s\r\n", *digest);

	if (headers.has("Sec-Websocket-Protocol"))
		client << "Sec-Websocket-Protocol: chat\r\n";
	client << "\r\n";

	WebSocket ws(client, false);
	{
		Lock l(_mutex);
		_clients << &ws;
	}
	serve(ws);
	{
		Lock l(_mutex);
		_clients.removeOne(&ws);
	}
	client.close();
}